

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

uint128 absl::anon_unknown_2::MakeUint128FromFloat<long_double>(longdouble v)

{
  bool bVar1;
  bool bVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  double __x;
  double dVar6;
  uint64_t lo;
  uint64_t hi;
  longdouble v_local;
  
  bVar2 = std::isfinite(v);
  bVar1 = false;
  dVar6 = __x;
  if ((bVar2) && (bVar1 = false, -(longdouble)1 < v)) {
    dVar6 = std::ldexp(__x,0x80);
    bVar1 = v < in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
  }
  if (bVar1) {
    dVar6 = std::ldexp(dVar6,0x40);
    if (v < in_ST0) {
      lVar3 = (longdouble)9.223372e+18;
      lVar4 = (longdouble)0;
      if (lVar3 <= v) {
        lVar4 = lVar3;
      }
      join_0x00000010_0x00000000_ =
           MakeUint128(0,(long)ROUND(v - lVar4) ^ (ulong)(lVar3 <= v) << 0x3f);
    }
    else {
      dVar6 = std::ldexp(dVar6,-0x40);
      lVar3 = (longdouble)9.223372e+18;
      lVar4 = (longdouble)0;
      if (lVar3 <= in_ST1) {
        lVar4 = lVar3;
      }
      std::ldexp(dVar6,0x40);
      in_ST2 = v - in_ST2;
      lVar5 = (longdouble)0;
      if (lVar3 <= in_ST2) {
        lVar5 = lVar3;
      }
      join_0x00000010_0x00000000_ =
           MakeUint128((long)ROUND(in_ST1 - lVar4) ^ (ulong)(lVar3 <= in_ST1) << 0x3f,
                       (long)ROUND(in_ST2 - lVar5) ^ (ulong)(lVar3 <= in_ST2) << 0x3f);
    }
    return stack0xffffffffffffffe8;
  }
  __assert_fail("std::isfinite(v) && v > -1 && (std::numeric_limits<T>::max_exponent <= 128 || v < std::ldexp(static_cast<T>(1), 128))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/numeric/int128.cc"
                ,100,
                "uint128 absl::(anonymous namespace)::MakeUint128FromFloat(T) [T = long double]");
}

Assistant:

uint128 MakeUint128FromFloat(T v) {
  static_assert(std::is_floating_point<T>::value, "");

  // Rounding behavior is towards zero, same as for built-in types.

  // Undefined behavior if v is NaN or cannot fit into uint128.
  assert(std::isfinite(v) && v > -1 &&
         (std::numeric_limits<T>::max_exponent <= 128 ||
          v < std::ldexp(static_cast<T>(1), 128)));

  if (v >= std::ldexp(static_cast<T>(1), 64)) {
    uint64_t hi = static_cast<uint64_t>(std::ldexp(v, -64));
    uint64_t lo = static_cast<uint64_t>(v - std::ldexp(static_cast<T>(hi), 64));
    return MakeUint128(hi, lo);
  }

  return MakeUint128(0, static_cast<uint64_t>(v));
}